

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

void xcb_input_feedback_ctl_next(xcb_input_feedback_ctl_iterator_t *i)

{
  xcb_input_feedback_ctl_t *pxVar1;
  int iVar2;
  xcb_input_feedback_ctl_t *_aux;
  long in_FS_OFFSET;
  xcb_input_feedback_ctl_data_t _aux_1;
  undefined1 *local_58;
  undefined1 *puStack_50;
  anon_struct_8_4_8d516570_for_pointer local_48;
  undefined1 *puStack_40;
  xcb_keysym_t *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar1 = i->data;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (xcb_keysym_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (anon_struct_8_4_8d516570_for_pointer)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  iVar2 = xcb_input_feedback_ctl_data_unpack
                    (pxVar1 + 1,pxVar1->class_id,(xcb_input_feedback_ctl_data_t *)&local_58);
  i->index = (int)(xcb_input_feedback_ctl_t *)(&pxVar1->class_id + (iVar2 + 4)) - *(int *)&i->data;
  i->rem = i->rem + -1;
  i->data = (xcb_input_feedback_ctl_t *)(&pxVar1->class_id + (iVar2 + 4));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
xcb_input_feedback_ctl_next (xcb_input_feedback_ctl_iterator_t *i)
{
    xcb_input_feedback_ctl_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_feedback_ctl_t *)(((char *)R) + xcb_input_feedback_ctl_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_feedback_ctl_t *) child.data;
}